

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

Data2D<double> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<1,(TasGrid::TypeOneDRule)37,double>
          (Data2D<double> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  pointer piVar1;
  size_t sVar2;
  pointer pdVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  allocator_type local_19;
  
  sVar4 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  iVar6 = work->cache_num_indexes;
  __return_storage_ptr__->stride = sVar4;
  __return_storage_ptr__->num_strips = (long)iVar6;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vec,(long)iVar6 * sVar4,&local_19);
  iVar6 = work->cache_num_indexes;
  if (0 < iVar6) {
    uVar9 = (ulong)(uint)(this->super_BaseCanonicalGrid).num_dimensions;
    lVar5 = 0;
    do {
      if (0 < (int)uVar9) {
        sVar4 = work->num_dimensions;
        piVar1 = (work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar2 = __return_storage_ptr__->stride;
        pdVar3 = (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = 0;
        do {
          uVar8 = piVar1[sVar4 * lVar5 + lVar7];
          dVar10 = -1.0;
          if (uVar8 != 0) {
            dVar10 = 1.0;
            if (2 < uVar8) {
              uVar8 = uVar8 - 1;
              iVar6 = 1;
              do {
                uVar8 = (int)uVar8 >> 1;
                iVar6 = iVar6 * 2;
              } while (1 < uVar8);
              dVar10 = (double)iVar6;
            }
            dVar10 = 1.0 / dVar10;
          }
          pdVar3[sVar2 * lVar5 + lVar7] = dVar10;
          lVar7 = lVar7 + 1;
          uVar9 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
        } while (lVar7 < (long)uVar9);
        iVar6 = work->cache_num_indexes;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }